

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void convolutional_decode_warmup(correct_convolutional *conv,uint sets,uint8_t *soft)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  long in_RDX;
  uint in_ESI;
  long *in_RDI;
  distance_t dist;
  uint last;
  size_t j;
  distance_t *write_errors;
  distance_t *read_errors;
  uint out;
  uint i;
  distance_t local_3e;
  ulong local_38;
  uint local_20;
  uint local_1c;
  
  for (local_1c = 0; (ulong)local_1c < in_RDI[2] - 1U && local_1c < in_ESI; local_1c = local_1c + 1)
  {
    if (in_RDX == 0) {
      bVar3 = bit_reader_read((bit_reader_t *)in_RDI[5],(uint)in_RDI[1]);
      local_20 = (uint)bVar3;
    }
    lVar1 = *(long *)(in_RDI[0xf] + 0x20);
    lVar2 = *(long *)(in_RDI[0xf] + 0x28);
    for (local_38 = 0; local_38 < (ulong)(long)(1 << ((char)local_1c + 1U & 0x1f));
        local_38 = local_38 + 1) {
      if (in_RDX == 0) {
        local_3e = metric_distance(*(uint *)(*in_RDI + local_38 * 4),local_20);
      }
      else if ((int)in_RDI[0xd] == 0) {
        local_3e = metric_soft_distance_linear
                             (*(uint *)(*in_RDI + local_38 * 4),
                              (uint8_t *)(in_RDX + (ulong)local_1c * in_RDI[1]),in_RDI[1]);
      }
      else {
        local_3e = metric_soft_distance_quadratic
                             (*(uint *)(*in_RDI + local_38 * 4),
                              (uint8_t *)(in_RDX + (ulong)local_1c * in_RDI[1]),in_RDI[1]);
      }
      *(distance_t *)(lVar2 + local_38 * 2) =
           local_3e + *(short *)(lVar1 + (local_38 >> 1 & 0xffffffff) * 2);
    }
    error_buffer_swap((error_buffer_t *)in_RDI[0xf]);
  }
  return;
}

Assistant:

void convolutional_decode_warmup(correct_convolutional *conv, unsigned int sets,
                                 const uint8_t *soft) {
    // first phase: load shiftregister up from 0 (order goes from 1 to conv->order)
    // we are building up error metrics for the first order bits
    for (unsigned int i = 0; i < conv->order - 1 && i < sets; i++) {
        // peel off rate bits from encoded to recover the same `out` as in the encoding process
        // the difference being that this `out` will have the channel noise/errors applied
        unsigned int out;
        if (!soft) {
            out = bit_reader_read(conv->bit_reader, conv->rate);
        }
        const distance_t *read_errors = conv->errors->read_errors;
        distance_t *write_errors = conv->errors->write_errors;
        // walk all of the state we have so far
        for (size_t j = 0; j < (1 << (i + 1)); j += 1) {
            unsigned int last = j >> 1;
            distance_t dist;
            if (soft) {
                if (conv->soft_measurement == CORRECT_SOFT_LINEAR) {
                    dist = metric_soft_distance_linear(conv->table[j], soft + i * conv->rate,
                                                       conv->rate);
                } else {
                    dist = metric_soft_distance_quadratic(conv->table[j], soft + i * conv->rate,
                                                          conv->rate);
                }
            } else {
                dist = metric_distance(conv->table[j], out);
            }
            write_errors[j] = dist + read_errors[last];
        }
        error_buffer_swap(conv->errors);
    }
}